

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O0

char * Curl_chunked_strerror(CHUNKcode code)

{
  char *pcStack_10;
  CHUNKcode code_local;
  
  switch(code) {
  case CHUNKE_TOO_LONG_HEX:
    pcStack_10 = "Too long hexadecimal number";
    break;
  case CHUNKE_ILLEGAL_HEX:
    pcStack_10 = "Illegal or missing hexadecimal sequence";
    break;
  case CHUNKE_BAD_CHUNK:
    pcStack_10 = "Malformed encoding found";
    break;
  case CHUNKE_BAD_ENCODING:
    pcStack_10 = "Bad content-encoding found";
    break;
  case CHUNKE_OUT_OF_MEMORY:
    pcStack_10 = "Out of memory";
    break;
  case CHUNKE_PASSTHRU_ERROR:
    pcStack_10 = "Error writing data to client";
    break;
  default:
    pcStack_10 = "OK";
  }
  return pcStack_10;
}

Assistant:

static const char *Curl_chunked_strerror(CHUNKcode code)
{
  switch(code) {
  default:
    return "OK";
  case CHUNKE_TOO_LONG_HEX:
    return "Too long hexadecimal number";
  case CHUNKE_ILLEGAL_HEX:
    return "Illegal or missing hexadecimal sequence";
  case CHUNKE_BAD_CHUNK:
    return "Malformed encoding found";
  case CHUNKE_PASSTHRU_ERROR:
    return "Error writing data to client";
  case CHUNKE_BAD_ENCODING:
    return "Bad content-encoding found";
  case CHUNKE_OUT_OF_MEMORY:
    return "Out of memory";
  }
}